

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O2

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForQuadsTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  _tess_coordinate_cartesian *p_Var1;
  ostringstream *poVar2;
  float fVar3;
  pointer pcVar4;
  _tess_coordinate_cartesian this_00;
  _tess_coordinate_cartesian _Var5;
  _tess_coordinate_cartesian __comp;
  _tess_edge *p_Var6;
  bool bVar7;
  _tess_coordinate_cartesian *coordinate;
  pointer p_Var8;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  _Var9;
  _tess_coordinate_cartesian _Var10;
  MessageBuilder *pMVar11;
  TestError *this_01;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing vertex_spacing;
  uint n_edge;
  ulong uVar12;
  long lVar13;
  uint n_vertex;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  _tess_coordinate_cartesian local_388;
  _tess_coordinate_cartesian local_380;
  _tess_coordinate_cartesian local_378;
  _tess_coordinate_cartesian local_370;
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  coordinates;
  _tess_edge local_318;
  _tess_edge local_2e8;
  _tess_edge local_2b8;
  _tess_edge local_288;
  float *local_260;
  TessellationShaderVertexSpacing *local_258;
  ulong local_250;
  _tess_coordinate_cartesian edge_end_point;
  _tess_coordinate_cartesian edge_start_point;
  _tess_edge *edge_ptrs [4];
  _tess_coordinate_cartesian *corner_coordinate_ptrs [4];
  string vertex_spacing_string;
  string primitive_mode_string;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [376];
  
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coordinates.
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coordinates.
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coordinates.
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = 0;
  local_258 = this;
  for (uVar14 = 0; uVar14 < run->n_vertices; uVar14 = uVar14 + 1) {
    pcVar4 = (run->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1b0._4_4_ = *(float *)(pcVar4 + (uVar12 & 0xffffffff) * 4 + 4);
    local_1b0._0_4_ = *(float *)(pcVar4 + (uVar12 & 0xffffffff) * 4);
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&coordinates,(value_type *)local_1b0);
    uVar12 = uVar12 + 3;
  }
  fVar3 = run->inner[0];
  local_260 = run->inner + 1;
  uVar12 = 0;
  do {
    if ((int)uVar12 == (1.0 < fVar3) + 1) {
      std::
      _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::~_Vector_base(&coordinates.
                       super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     );
      return __return_storage_ptr__;
    }
    local_370.x = 0.0;
    local_370.y = 0.0;
    local_378.x = 0.0;
    local_378.y = 0.0;
    local_380.x = 0.0;
    local_380.y = 0.0;
    local_388.x = 0.0;
    local_388.y = 0.0;
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    for (p_Var8 = coordinates.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 != coordinates.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  ._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
      fVar20 = p_Var8->x + -0.5;
      fVar21 = p_Var8->y + -0.5;
      fVar19 = SQRT(fVar20 * fVar20 + fVar21 * fVar21);
      if (((fVar20 <= 0.0) && (0.0 <= fVar21)) && (fVar18 < fVar19)) {
        local_370 = *p_Var8;
        fVar18 = fVar19;
      }
      if (((0.0 <= fVar20) && (0.0 <= fVar21)) && (fVar17 < fVar19)) {
        local_378 = *p_Var8;
        fVar17 = fVar19;
      }
      if (((fVar20 <= 0.0) && (fVar21 <= 0.0)) && (fVar16 < fVar19)) {
        local_380 = *p_Var8;
        fVar16 = fVar19;
      }
      if (((0.0 <= fVar20) && (fVar21 <= 0.0)) && (fVar15 < fVar19)) {
        local_388 = *p_Var8;
        fVar15 = fVar19;
      }
    }
    corner_coordinate_ptrs[0] = &local_370;
    corner_coordinate_ptrs[1] = &local_378;
    corner_coordinate_ptrs[2] = &local_380;
    corner_coordinate_ptrs[3] = &local_388;
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const>>
                        (coordinates.
                         super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         coordinates.
                         super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                         ._M_impl.super__Vector_impl_data._M_finish,corner_coordinate_ptrs[lVar13]);
      if (_Var9._M_current !=
          coordinates.
          super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var1 = _Var9._M_current + 1;
        if (p_Var1 != coordinates.
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          memmove(_Var9._M_current,p_Var1,
                  (long)coordinates.
                        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1);
        }
        coordinates.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             coordinates.
             super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
      }
    }
    local_318.edge_length =
         SQRT((local_370.x - local_378.x) * (local_370.x - local_378.x) +
              (local_370.y - local_378.y) * (local_370.y - local_378.y));
    local_288.edge_length =
         SQRT((local_378.x - local_388.x) * (local_378.x - local_388.x) +
              (local_378.y - local_388.y) * (local_378.y - local_388.y));
    local_2b8.edge_length =
         SQRT((local_388.x - local_380.x) * (local_388.x - local_380.x) +
              (local_388.y - local_380.y) * (local_388.y - local_380.y));
    local_2e8.edge_length =
         SQRT((local_380.x - local_370.x) * (local_380.x - local_370.x) +
              (local_380.y - local_370.y) * (local_380.y - local_370.y));
    local_318.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_318.outermost_tess_level = run->outer[3];
    local_288.outermost_tess_level = run->outer[2];
    local_2b8.outermost_tess_level = run->outer[1];
    local_2e8.outermost_tess_level = run->outer[0];
    local_288.tess_level = local_288.outermost_tess_level;
    local_2b8.tess_level = local_2b8.outermost_tess_level;
    local_2e8.tess_level = local_2e8.outermost_tess_level;
    local_318.tess_level = local_318.outermost_tess_level;
    if ((int)uVar12 != 0) {
      local_2b8.tess_level = run->inner[0] + -2.0;
      local_288.tess_level = run->inner[1] + -2.0;
      local_2e8.tess_level = local_288.tess_level;
      local_318.tess_level = local_2b8.tess_level;
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&local_318.points,&local_370);
    bVar7 = _tess_coordinate_cartesian::operator==(&local_370,&local_378);
    if (!bVar7) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back(&local_318.points,&local_378);
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&local_288.points,&local_378);
    bVar7 = _tess_coordinate_cartesian::operator==(&local_378,&local_388);
    if (!bVar7) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back(&local_288.points,&local_388);
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&local_2b8.points,&local_388);
    bVar7 = _tess_coordinate_cartesian::operator==(&local_388,&local_380);
    if (!bVar7) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back(&local_2b8.points,&local_380);
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&local_2e8.points,&local_380);
    _Var10 = (_tess_coordinate_cartesian)&local_380;
    bVar7 = _tess_coordinate_cartesian::operator==((_tess_coordinate_cartesian *)_Var10,&local_370);
    if (!bVar7) {
      _Var10 = (_tess_coordinate_cartesian)&local_2e8;
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)_Var10,&local_370);
    }
    edge_ptrs[0] = &local_318;
    edge_ptrs[1] = &local_288;
    edge_ptrs[2] = &local_2b8;
    edge_ptrs[3] = &local_2e8;
    local_250 = uVar12;
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      this_00 = *(_tess_coordinate_cartesian *)(edge_ptrs + lVar13);
      _Var5 = *(_tess_coordinate_cartesian *)this_00;
      if (8 < (ulong)((long)*(_tess_coordinate_cartesian *)((long)this_00 + 8) - (long)_Var5)) {
        __comp = *(_tess_coordinate_cartesian *)_Var5;
        edge_end_point = *(_tess_coordinate_cartesian *)((long)_Var5 + 8);
        edge_start_point = __comp;
        for (p_Var8 = coordinates.
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            p_Var8 != coordinates.
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                      ._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
          bVar7 = isPointOnLine((TessellationShaderVertexSpacing *)_Var10,&edge_start_point,
                                &edge_end_point,p_Var8);
          if (bVar7) {
            _Var10 = (_tess_coordinate_cartesian)&edge_start_point;
            bVar7 = _tess_coordinate_cartesian::operator==(&edge_start_point,p_Var8);
            if (!bVar7) {
              _Var10 = (_tess_coordinate_cartesian)&edge_end_point;
              bVar7 = _tess_coordinate_cartesian::operator==(&edge_end_point,p_Var8);
              if (!bVar7) {
                _Var10 = (_tess_coordinate_cartesian)
                         std::
                         __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_pred<glcts::TessellationShaderVertexSpacing::_comparator_exact_tess_coordinate_match>>
                                   (*p_Var8,*(_tess_coordinate_cartesian *)this_00,
                                    *(_tess_coordinate_cartesian *)((long)this_00 + 8));
                if (_Var10 != *(_tess_coordinate_cartesian *)((long)this_00 + 8)) {
                  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                            (&primitive_mode_string,
                             (TessellationShaderUtils *)(ulong)run->primitive_mode,primitive_mode);
                  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                            (&vertex_spacing_string,
                             (TessellationShaderUtils *)(ulong)run->vertex_spacing,vertex_spacing);
                  local_1b0 = (undefined1  [8])
                              ((local_258->super_TestCaseBase).super_TestCase.super_TestNode.
                              m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream(local_1a8);
                  std::operator<<((ostream *)local_1a8,"A duplicate vertex");
                  std::operator<<((ostream *)local_1a8," (");
                  pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&p_Var8->x);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&p_Var8->y);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,
                                  ") was found in set of coordinates generated for the following configuration:"
                                 );
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,
                                  " inner tessellation levels:(");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,run->inner);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,local_260);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,
                                  ") outer tessellation levels:(");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,run->outer);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,run->outer + 1);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,run->outer + 2);
                  std::operator<<(&(pMVar11->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,", ");
                  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,run->outer + 3);
                  poVar2 = &pMVar11->m_str;
                  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                                  ") primitive mode:");
                  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                                  (string *)&primitive_mode_string);
                  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                                  " vertex spacing mode:");
                  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                                  (string *)&vertex_spacing_string);
                  std::operator<<(&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                                  " point mode:yes");
                  tcu::MessageBuilder::operator<<
                            (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  this_01 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (this_01,
                             "A duplicate vertex was found in generated tessellation coordinate set when point mode was used"
                             ,(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                             ,0x1d9);
                  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                }
                _Var10 = this_00;
                std::
                vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                             *)this_00,p_Var8);
              }
            }
          }
        }
        _Var10 = *(_tess_coordinate_cartesian *)this_00;
        std::
        __sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>>
                  ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                    )_Var10,(__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                             )*(_tess_coordinate_cartesian *)((long)this_00 + 8),
                   (_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>
                    )__comp);
      }
    }
    for (lVar13 = 0; uVar12 = local_250, lVar13 != 4; lVar13 = lVar13 + 1) {
      p_Var6 = edge_ptrs[lVar13];
      for (p_Var8 = (p_Var6->points).
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var8 != (p_Var6->points).
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                    ._M_impl.super__Vector_impl_data._M_finish; p_Var8 = p_Var8 + 1) {
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const>>
                          (coordinates.
                           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           coordinates.
                           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                           ._M_impl.super__Vector_impl_data._M_finish,p_Var8);
        if (_Var9._M_current !=
            coordinates.
            super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          p_Var1 = _Var9._M_current + 1;
          if (p_Var1 != coordinates.
                        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            memmove(_Var9._M_current,p_Var1,
                    (long)coordinates.
                          super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1);
          }
          coordinates.
          super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               coordinates.
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
      }
    }
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
      ::push_back(__return_storage_ptr__,edge_ptrs[lVar13]);
    }
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::~_Vector_base((_Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     *)&local_2e8);
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::~_Vector_base((_Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     *)&local_2b8);
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::~_Vector_base((_Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     *)&local_288);
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::~_Vector_base((_Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     *)&local_318);
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForQuadsTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First, convert the raw coordinate array into a vector of cartesian coordinates.
	 * For this method, we will need to take out vertices in no specific order. */
	std::vector<_tess_coordinate_cartesian> coordinates;

	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		_tess_coordinate_cartesian new_coordinate;
		const float*			   vertex_data = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;

		new_coordinate.x = vertex_data[0];
		new_coordinate.y = vertex_data[1];

		coordinates.push_back(new_coordinate);
	}

	/* Data set is expected to describe an outer and inner rectangles. We will execute the quad extraction
	 * process in two iterations:
	 *
	 * - first iteration will determine all coordinates that are part of the outer quad;
	 * - second iteration will focus on the inner quad.
	 *
	 * Each iteration will start from identifying corner vertices:
	 *
	 * - top-left corner     (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive);
	 * - top-right corner    (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive);
	 * - bottom-left corner  (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative);
	 * - bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative);
	 *
	 * Once we know where the corner vertices are, we will remove them from the data set and iterate again over the
	 * data set to identify all points that are part of edges connecting the edge corners. After the loop is done,
	 * these vertices will have been associated with relevant edges and removed from the data sets.
	 *
	 * Once two iterations are complete, we're done.
	 */
	const unsigned int n_iterations = (run.inner[0] > 1) ? 2 : 1;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_tess_coordinate_cartesian current_tl_point;
		float					   current_tl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_tr_point;
		float					   current_tr_point_delta = 0.0f;
		_tess_coordinate_cartesian current_bl_point;
		float					   current_bl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_br_point;
		float					   current_br_point_delta = 0.0f;

		/* Iterate over all points */
		for (std::vector<_tess_coordinate_cartesian>::const_iterator coordinate_iterator = coordinates.begin();
			 coordinate_iterator != coordinates.end(); coordinate_iterator++)
		{
			const _tess_coordinate_cartesian& coordinate = *coordinate_iterator;
			float							  delta_x	= coordinate.x - 0.5f;
			float							  delta_y	= coordinate.y - 0.5f;
			float							  delta		 = deFloatSqrt(delta_x * delta_x + delta_y * delta_y);

			/* top-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive); */
			if (delta_x <= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tl_point_delta)
				{
					current_tl_point	   = coordinate;
					current_tl_point_delta = delta;
				}
			}

			/* top-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive); */
			if (delta_x >= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tr_point_delta)
				{
					current_tr_point	   = coordinate;
					current_tr_point_delta = delta;
				}
			}

			/* bottom-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative); */
			if (delta_x <= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_bl_point_delta)
				{
					current_bl_point	   = coordinate;
					current_bl_point_delta = delta;
				}
			}

			/* bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative); */
			if (delta_x >= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_br_point_delta)
				{
					current_br_point	   = coordinate;
					current_br_point_delta = delta;
				}
			}
		} /* for (all coordinates) */

		/* Note: If any of the outer tessellation level is 1, at least
		 *       two "current" points will refer to the same point.
		 *
		 * Now that we know where the corner vertices are, remove them from the data set
		 */
		const _tess_coordinate_cartesian* corner_coordinate_ptrs[] = { &current_tl_point, &current_tr_point,
																	   &current_bl_point, &current_br_point };
		const unsigned int n_corner_coordinate_ptrs =
			sizeof(corner_coordinate_ptrs) / sizeof(corner_coordinate_ptrs[0]);

		for (unsigned int n_corner_coordinate = 0; n_corner_coordinate < n_corner_coordinate_ptrs;
			 ++n_corner_coordinate)
		{
			const _tess_coordinate_cartesian& corner_coordinate = *(corner_coordinate_ptrs[n_corner_coordinate]);
			std::vector<_tess_coordinate_cartesian>::iterator iterator =
				std::find(coordinates.begin(), coordinates.end(), corner_coordinate);

			/* Iterator can be invalid at this point of any of the corner coordinates
			 * referred more than once to the same point. */
			if (iterator != coordinates.end())
			{
				coordinates.erase(iterator);
			}
		} /* for (all corner coordinates) */

		/* Proceed with identification of coordinates describing the edges.
		 *
		 * Note: for inner quad, we need to subtract 2 segments connecting outer and inner coordinates */
		float tl_tr_delta =
			deFloatSqrt((current_tl_point.x - current_tr_point.x) * (current_tl_point.x - current_tr_point.x) +
						(current_tl_point.y - current_tr_point.y) * (current_tl_point.y - current_tr_point.y));
		float tr_br_delta =
			deFloatSqrt((current_tr_point.x - current_br_point.x) * (current_tr_point.x - current_br_point.x) +
						(current_tr_point.y - current_br_point.y) * (current_tr_point.y - current_br_point.y));
		float br_bl_delta =
			deFloatSqrt((current_br_point.x - current_bl_point.x) * (current_br_point.x - current_bl_point.x) +
						(current_br_point.y - current_bl_point.y) * (current_br_point.y - current_bl_point.y));
		float bl_tl_delta =
			deFloatSqrt((current_bl_point.x - current_tl_point.x) * (current_bl_point.x - current_tl_point.x) +
						(current_bl_point.y - current_tl_point.y) * (current_bl_point.y - current_tl_point.y));

		_tess_edge tl_tr_edge(0, 0, tl_tr_delta);
		_tess_edge tr_br_edge(0, 0, tr_br_delta);
		_tess_edge br_bl_edge(0, 0, br_bl_delta);
		_tess_edge bl_tl_edge(0, 0, bl_tl_delta);

		tl_tr_edge.outermost_tess_level = run.outer[3];
		tr_br_edge.outermost_tess_level = run.outer[2];
		br_bl_edge.outermost_tess_level = run.outer[1];
		bl_tl_edge.outermost_tess_level = run.outer[0];

		if (n_iteration == 0)
		{
			tl_tr_edge.tess_level = run.outer[3];
			tr_br_edge.tess_level = run.outer[2];
			br_bl_edge.tess_level = run.outer[1];
			bl_tl_edge.tess_level = run.outer[0];
		}
		else
		{
			tl_tr_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			br_bl_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			tr_br_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
			bl_tl_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
		}

		/* Add corner points to edge descriptors. Do *NOT* add the same point twice, as
		 * that will confuse verifyEdges() and cause incorrect failures.
		 */
		tl_tr_edge.points.push_back(current_tl_point);

		if (!(current_tl_point == current_tr_point))
		{
			tl_tr_edge.points.push_back(current_tr_point);
		}

		tr_br_edge.points.push_back(current_tr_point);

		if (!(current_tr_point == current_br_point))
		{
			tr_br_edge.points.push_back(current_br_point);
		}

		br_bl_edge.points.push_back(current_br_point);

		if (!(current_br_point == current_bl_point))
		{
			br_bl_edge.points.push_back(current_bl_point);
		}

		bl_tl_edge.points.push_back(current_bl_point);

		if (!(current_bl_point == current_tl_point))
		{
			bl_tl_edge.points.push_back(current_tl_point);
		}

		/* Identify points that lie on any of the edges considered */
		_tess_edge*		   edge_ptrs[] = { &tl_tr_edge, &tr_br_edge, &br_bl_edge, &bl_tl_edge };
		const unsigned int n_edge_ptrs = sizeof(edge_ptrs) / sizeof(edge_ptrs[0]);

		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			/* Degenerate edges will only consist of one point, for which the following
			 * code needs not be executed */
			if (edge.points.size() > 1)
			{
				/* Retrieve edge's start & end points */
				_tess_coordinate_cartesian edge_start_point = edge.points[0];
				_tess_coordinate_cartesian edge_end_point   = edge.points[1];

				/* Iterate over the data set */
				for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = coordinates.begin();
					 iterator != coordinates.end(); iterator++)
				{
					const _tess_coordinate_cartesian& coordinate = *iterator;

					if (isPointOnLine(edge_start_point, edge_end_point, coordinate) &&
						!(edge_start_point == coordinate) && !(edge_end_point == coordinate))
					{
						/* Make sure the point has not already been added. If this happens,
						 * it is very likely there is a bug in the way the implementation's
						 * support of point mode */
						if (std::find_if(edge.points.begin(), edge.points.end(),
										 _comparator_exact_tess_coordinate_match(coordinate)) == edge.points.end())
						{
							edge.points.push_back(coordinate);
						}
						else
						{
							std::string primitive_mode_string =
								TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
							std::string vertex_spacing_string =
								TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

							m_testCtx.getLog()
								<< tcu::TestLog::Message << "A duplicate vertex"
								<< " (" << coordinate.x << ", " << coordinate.y
								<< ") was found in set of coordinates generated for the following configuration:"
								<< " inner tessellation levels:(" << run.inner[0] << ", " << run.inner[1]
								<< ") outer tessellation levels:(" << run.outer[0] << ", " << run.outer[1] << ", "
								<< run.outer[2] << ", " << run.outer[3] << ") primitive mode:" << primitive_mode_string
								<< " vertex spacing mode:" << vertex_spacing_string << " point mode:yes"
								<< tcu::TestLog::EndMessage;

							TCU_FAIL("A duplicate vertex was found in generated tessellation coordinate set "
									 "when point mode was used");
						}
					}
				} /* for (all coordinates in the data set) */

				/* Sort all points in the edge relative to the start point */
				std::sort(edge.points.begin(), edge.points.end(), _comparator_relative_to_base_point(edge_start_point));
			}
		} /* for (all edges) */

		/* Remove all coordinates associated to edges from the data set */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = edge.points.begin();
				 iterator != edge.points.end(); iterator++)
			{
				const _tess_coordinate_cartesian&				  coordinate = *iterator;
				std::vector<_tess_coordinate_cartesian>::iterator dataset_iterator =
					std::find(coordinates.begin(), coordinates.end(), coordinate);

				if (dataset_iterator != coordinates.end())
				{
					coordinates.erase(dataset_iterator);
				}
			} /* for (all edge points) */
		}	 /* for (all edges) */

		/* Store the edges */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			result.push_back(edge);
		}
	} /* for (both iterations) */

	return result;
}